

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

size_t __thiscall
adios2::core::engine::BP4Reader::UpdateBuffer
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds)

{
  Comm *this_00;
  BP4Deserializer *pBVar1;
  TransportMan *this_01;
  _func_int **pp_Var2;
  bool bVar3;
  size_t sVar4;
  _func_int *p_Var5;
  BP4Deserializer *m_BP4Deserializer;
  BP4Reader *this_02;
  size_type __n;
  ulong size;
  allocator local_b9;
  Seconds *local_b8;
  size_t newIdxSize;
  vector<char,_std::allocator<char>_> idxbuf;
  size_t expectedMinFileSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  string local_70;
  string local_50;
  
  idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8 = pollSeconds;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&sizes,3,(value_type_conflict9 *)&idxbuf,(allocator_type *)&newIdxSize);
  pBVar1 = &this->m_BP4Deserializer;
  if (*(int *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x10 +
              (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
    m_BP4Deserializer = (BP4Deserializer *)&this->m_MDIndexFileManager;
    sVar4 = transportman::TransportMan::GetFileSize((TransportMan *)m_BP4Deserializer,0);
    __n = sVar4 - this->m_MDIndexFileAlreadyReadSize;
    if (this->m_MDIndexFileAlreadyReadSize <= sVar4 && __n != 0) {
      std::vector<char,_std::allocator<char>_>::vector(&idxbuf,__n,(allocator_type *)&newIdxSize);
      transportman::TransportMan::ReadFile
                ((TransportMan *)m_BP4Deserializer,
                 idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__n,this->m_MDIndexFileAlreadyReadSize,0);
      MetadataCalculateMinFileSize
                (m_BP4Deserializer,&(this->super_Engine).m_Name,
                 idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__n,(bool)(this->m_IdxHeaderParsed ^ 1),
                 this->m_MDFileAlreadyReadSize,&newIdxSize,&expectedMinFileSize);
      p_Var5 = pBVar1->_vptr_BP4Deserializer[-3];
      if ((ulong)(*(long *)(p_Var5 + 0x88 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer)
                 - *(long *)(p_Var5 + 0x80 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer)
                 ) < newIdxSize) {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "re-allocating metadata index buffer, in call to BP4Reader::BeginStep/UpdateBuffer"
                   ,&local_b9);
        adios2::format::BufferSTL::Resize
                  ((BufferSTL *)(p_Var5 + 0x38 + (long)&(pBVar1->m_Minifooter).VersionTag),
                   newIdxSize,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        p_Var5 = pBVar1->_vptr_BP4Deserializer[-3];
      }
      adios2::format::BufferSTL::Reset
                ((BufferSTL *)(p_Var5 + 0x38 + (long)&(pBVar1->m_Minifooter).VersionTag),true,false)
      ;
      if (newIdxSize != 0) {
        memmove(*(void **)(pBVar1->_vptr_BP4Deserializer[-3] + 0x80 +
                          (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),
                idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,newIdxSize);
      }
      this_01 = &this->m_MDFileManager;
      do {
        this_02 = (BP4Reader *)this_01;
        sVar4 = transportman::TransportMan::GetFileSize(this_01,0);
        if (expectedMinFileSize <= sVar4) {
          local_b8 = (Seconds *)newIdxSize;
          size = expectedMinFileSize - this->m_MDFileAlreadyReadSize;
          p_Var5 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
          if ((ulong)(*(long *)(p_Var5 + 0xd0 +
                               (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) -
                     *(long *)(p_Var5 + 200 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer
                              )) < size) {
            std::__cxx11::string::string
                      ((string *)&local_70,"allocating metadata buffer, in call to BP4Reader Open",
                       &local_b9);
            adios2::format::BufferSTL::Resize
                      ((BufferSTL *)(&pBVar1->field_0x88 + (long)p_Var5),size,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            p_Var5 = pBVar1->_vptr_BP4Deserializer[-4];
          }
          adios2::format::BufferSTL::Reset
                    ((BufferSTL *)(&pBVar1->field_0x88 + (long)p_Var5),true,false);
          transportman::TransportMan::ReadFile
                    (this_01,*(char **)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 200 +
                                       (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),size,
                     this->m_MDFileAlreadyReadSize,0);
          this->m_MDFileAbsolutePos = this->m_MDFileAlreadyReadSize;
          this->m_MDFileAlreadyReadSize = expectedMinFileSize;
          this->m_MDIndexFileAlreadyReadSize =
               (long)&local_b8->__r + this->m_MDIndexFileAlreadyReadSize;
          *sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start = (unsigned_long)local_b8;
          sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[1] = this->m_MDFileAlreadyReadSize;
          sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[2] = this->m_MDFileAbsolutePos;
          break;
        }
        bVar3 = SleepOrQuit(this_02,timeoutInstant,local_b8);
      } while (bVar3);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&idxbuf.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  this_00 = &(this->super_Engine).m_Comm;
  helper::Comm::BroadcastVector<unsigned_long>(this_00,&sizes,0);
  sVar4 = *sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar4 != 0) {
    pp_Var2 = pBVar1->_vptr_BP4Deserializer;
    p_Var5 = pp_Var2[-4];
    if (*(int *)(p_Var5 + 0x10 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) != 0) {
      this->m_MDFileAlreadyReadSize =
           sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      this->m_MDFileAbsolutePos =
           sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      adios2::format::BufferSTL::Reset
                ((BufferSTL *)
                 (pp_Var2[-3] + 0x40 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),true,
                 false);
      adios2::format::BufferSTL::Reset
                ((BufferSTL *)(&pBVar1->field_0x88 + (long)pBVar1->_vptr_BP4Deserializer[-4]),true,
                 false);
      p_Var5 = pBVar1->_vptr_BP4Deserializer[-4];
    }
    helper::Comm::BroadcastVector<char>
              (this_00,(vector<char,_std::allocator<char>_> *)(&pBVar1->field_0xc8 + (long)p_Var5),0
              );
    helper::Comm::BroadcastVector<char>
              (this_00,(vector<char,_std::allocator<char>_> *)
                       (pBVar1->_vptr_BP4Deserializer[-3] + 0x28 +
                       (long)&(pBVar1->m_DeferredVariablesMap)._M_t),0);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return sVar4;
}

Assistant:

size_t BP4Reader::UpdateBuffer(const TimePoint &timeoutInstant, const Seconds &pollSeconds)
{
    std::vector<size_t> sizes(3, 0);
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        const size_t idxFileSize = m_MDIndexFileManager.GetFileSize(0);
        if (idxFileSize > m_MDIndexFileAlreadyReadSize)
        {
            const size_t maxIdxSize = idxFileSize - m_MDIndexFileAlreadyReadSize;
            std::vector<char> idxbuf(maxIdxSize);
            m_MDIndexFileManager.ReadFile(idxbuf.data(), maxIdxSize, m_MDIndexFileAlreadyReadSize);
            size_t newIdxSize;
            size_t expectedMinFileSize;
            char *buf = idxbuf.data();

            MetadataCalculateMinFileSize(m_BP4Deserializer, m_Name, buf, maxIdxSize,
                                         !m_IdxHeaderParsed, m_MDFileAlreadyReadSize, newIdxSize,
                                         expectedMinFileSize);

            // const uint64_t expectedMinFileSize = MetadataExpectedMinFileSize(
            //    m_BP4Deserializer, m_Name, !m_IdxHeaderParsed);

            if (m_BP4Deserializer.m_MetadataIndex.m_Buffer.size() < newIdxSize)
            {
                m_BP4Deserializer.m_MetadataIndex.Resize(
                    newIdxSize, "re-allocating metadata index buffer, in "
                                "call to BP4Reader::BeginStep/UpdateBuffer");
            }
            m_BP4Deserializer.m_MetadataIndex.Reset(true, false);
            std::copy(idxbuf.begin(), idxbuf.begin() + newIdxSize,
                      m_BP4Deserializer.m_MetadataIndex.m_Buffer.begin());

            /* Wait until as much metadata arrives in the file as much
             * is indicated by the existing index entries
             */

            size_t fileSize = 0;
            do
            {
                fileSize = m_MDFileManager.GetFileSize(0);
                if (fileSize >= expectedMinFileSize)
                {
                    break;
                }
            } while (SleepOrQuit(timeoutInstant, pollSeconds));

            if (fileSize >= expectedMinFileSize)
            {
                /* Read corresponding new metadata (throwing away the old)
                 * There may be unprocessed entries in the metadata if the index
                 * had less steps than the metadata file at the last read.
                 * Those steps are read again here, starting in the beginning of
                 * the buffer now.
                 */
                const size_t newMDSize = expectedMinFileSize - m_MDFileAlreadyReadSize;
                if (m_BP4Deserializer.m_Metadata.m_Buffer.size() < newMDSize)
                {
                    m_BP4Deserializer.m_Metadata.Resize(newMDSize,
                                                        "allocating metadata buffer, in call to "
                                                        "BP4Reader Open");
                }
                m_BP4Deserializer.m_Metadata.Reset(true, false);
                m_MDFileManager.ReadFile(m_BP4Deserializer.m_Metadata.m_Buffer.data(), newMDSize,
                                         m_MDFileAlreadyReadSize);

                m_MDFileAbsolutePos = m_MDFileAlreadyReadSize;
                m_MDFileAlreadyReadSize = expectedMinFileSize;

                m_MDIndexFileAlreadyReadSize += newIdxSize;

                sizes[0] = newIdxSize;
                sizes[1] = m_MDFileAlreadyReadSize;
                sizes[2] = m_MDFileAbsolutePos;
            }
        }
    }

    m_Comm.BroadcastVector(sizes, 0);
    size_t newIdxSize = sizes[0];

    if (newIdxSize > 0)
    {
        if (m_BP4Deserializer.m_RankMPI != 0)
        {
            m_MDFileAlreadyReadSize = sizes[1];
            m_MDFileAbsolutePos = sizes[2];
            m_BP4Deserializer.m_MetadataIndex.Reset(true, false);
            m_BP4Deserializer.m_Metadata.Reset(true, false);
            // we need this pointer in Metadata buffer on all processes
            // for parsing it correctly in ProcessMetadataForNewSteps()
        }

        // broadcast buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_Metadata.m_Buffer);

        // broadcast metadata index buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_MetadataIndex.m_Buffer);
    }
    return newIdxSize;
}